

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Formatter_inl.hpp
# Opt level: O3

string * __thiscall
CLI::Formatter::make_subcommand_abi_cxx11_(string *__return_storage_ptr__,Formatter *this,App *sub)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  bool bVar3;
  pointer pcVar4;
  size_t paragraphWidth;
  long *plVar5;
  undefined8 *puVar6;
  ulong *puVar7;
  undefined8 uVar8;
  ulong uVar9;
  string name;
  stringstream out;
  string local_278;
  ulong *local_258;
  long local_250;
  ulong local_248;
  long lStack_240;
  long *local_238;
  long local_230;
  long local_228;
  undefined8 uStack_220;
  string local_218;
  string local_1f8;
  string local_1d8;
  stringstream local_1b8 [16];
  long local_1a8 [2];
  long lStack_198;
  uint auStack_190 [22];
  ios_base local_138 [264];
  
  ::std::__cxx11::stringstream::stringstream(local_1b8);
  App::get_display_name_abi_cxx11_(&local_218,sub,true);
  plVar5 = (long *)::std::__cxx11::string::replace((ulong)&local_218,0,(char *)0x0,0x1b443f);
  paVar1 = &local_278.field_2;
  puVar7 = (ulong *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar7) {
    local_278.field_2._M_allocated_capacity = *puVar7;
    local_278.field_2._8_4_ = (undefined4)plVar5[3];
    local_278.field_2._12_4_ = *(undefined4 *)((long)plVar5 + 0x1c);
    local_278._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_278.field_2._M_allocated_capacity = *puVar7;
    local_278._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_278._M_string_length = plVar5[1];
  *plVar5 = (long)puVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  bVar3 = sub->required_;
  if (bVar3 == true) {
    local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"REQUIRED","");
    FormatterBase::get_label(&local_1d8,&this->super_FormatterBase,&local_1f8);
    plVar5 = (long *)::std::__cxx11::string::replace((ulong)&local_1d8,0,(char *)0x0,0x1b4440);
    local_258 = &local_248;
    puVar7 = (ulong *)(plVar5 + 2);
    if ((ulong *)*plVar5 == puVar7) {
      local_248 = *puVar7;
      lStack_240 = plVar5[3];
    }
    else {
      local_248 = *puVar7;
      local_258 = (ulong *)*plVar5;
    }
    local_250 = plVar5[1];
    *plVar5 = (long)puVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
  }
  else {
    local_258 = &local_248;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"");
  }
  uVar8 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != paVar1) {
    uVar8 = local_278.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar8 < local_250 + local_278._M_string_length) {
    uVar9 = 0xf;
    if (local_258 != &local_248) {
      uVar9 = local_248;
    }
    if (local_250 + local_278._M_string_length <= uVar9) {
      puVar6 = (undefined8 *)
               ::std::__cxx11::string::replace
                         ((ulong)&local_258,0,(char *)0x0,(ulong)local_278._M_dataplus._M_p);
      goto LAB_00124c55;
    }
  }
  puVar6 = (undefined8 *)::std::__cxx11::string::_M_append((char *)&local_278,(ulong)local_258);
LAB_00124c55:
  local_238 = &local_228;
  plVar5 = puVar6 + 2;
  if ((long *)*puVar6 == plVar5) {
    local_228 = *plVar5;
    uStack_220 = puVar6[3];
  }
  else {
    local_228 = *plVar5;
    local_238 = (long *)*puVar6;
  }
  local_230 = puVar6[1];
  *puVar6 = plVar5;
  puVar6[1] = 0;
  *(undefined1 *)plVar5 = 0;
  if (local_258 != &local_248) {
    operator_delete(local_258,local_248 + 1);
  }
  if (bVar3 != false) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
      operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
      operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != paVar1) {
    operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
  }
  paVar2 = &local_218.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != paVar2) {
    operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
  }
  *(long *)((long)&lStack_198 + *(long *)(local_1a8[0] + -0x18)) =
       (long)(int)(this->super_FormatterBase).column_width_;
  *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) =
       *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) & 0xffffff4f | 0x20;
  ::std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,(char *)local_238,local_230);
  pcVar4 = (sub->description_)._M_dataplus._M_p;
  local_278._M_dataplus._M_p = (pointer)paVar1;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_278,pcVar4,pcVar4 + (sub->description_)._M_string_length);
  paragraphWidth = (this->super_FormatterBase).right_column_width_;
  local_218._M_dataplus._M_p = (pointer)paVar2;
  ::std::__cxx11::string::_M_construct
            ((ulong)&local_218,(char)(this->super_FormatterBase).column_width_);
  detail::streamOutAsParagraph((ostream *)local_1a8,&local_278,paragraphWidth,&local_218,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != paVar2) {
    operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != paVar1) {
    operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
  }
  local_278._M_dataplus._M_p._0_1_ = 10;
  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,(char *)&local_278,1);
  ::std::__cxx11::stringbuf::str();
  if (local_238 != &local_228) {
    operator_delete(local_238,local_228 + 1);
  }
  ::std::__cxx11::stringstream::~stringstream(local_1b8);
  ::std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

CLI11_INLINE std::string Formatter::make_subcommand(const App *sub) const {
    std::stringstream out;
    std::string name = "  " + sub->get_display_name(true) + (sub->get_required() ? " " + get_label("REQUIRED") : "");

    out << std::setw(static_cast<int>(column_width_)) << std::left << name;
    detail::streamOutAsParagraph(
        out, sub->get_description(), right_column_width_, std::string(column_width_, ' '), true);
    out << '\n';
    return out.str();
}